

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qrhigles2.cpp
# Opt level: O0

bool __thiscall QGles2Sampler::create(QGles2Sampler *this)

{
  GLenum GVar1;
  QRhiImplementation *in_RDI;
  undefined1 unaff_retaddr;
  QRhiGles2 *rhiD;
  QRhiImplementation *this_00;
  
  this_00 = in_RDI;
  GVar1 = toGlMinFilter(*(Filter *)((long)&in_RDI->implThread + 4),
                        (Filter)(in_RDI->resUpdPool).super_QVLABase<QRhiResourceUpdateBatch_*>.
                                super_QVLABaseBase.a);
  *(GLenum *)
   ((long)&(in_RDI->resUpdPool).super_QVLABase<QRhiResourceUpdateBatch_*>.super_QVLABaseBase.ptr + 4
   ) = GVar1;
  GVar1 = toGlMagFilter(*(Filter *)&in_RDI->implThread);
  *(GLenum *)(in_RDI->resUpdPool).super_QVLAStorage<8UL,_8UL,_4LL>.array = GVar1;
  GVar1 = toGlWrapMode(*(AddressMode *)
                        ((long)&(in_RDI->resUpdPool).super_QVLABase<QRhiResourceUpdateBatch_*>.
                                super_QVLABaseBase.a + 4));
  *(GLenum *)((in_RDI->resUpdPool).super_QVLAStorage<8UL,_8UL,_4LL>.array + 4) = GVar1;
  GVar1 = toGlWrapMode((AddressMode)
                       (in_RDI->resUpdPool).super_QVLABase<QRhiResourceUpdateBatch_*>.
                       super_QVLABaseBase.s);
  *(GLenum *)((in_RDI->resUpdPool).super_QVLAStorage<8UL,_8UL,_4LL>.array + 8) = GVar1;
  GVar1 = toGlWrapMode(*(AddressMode *)
                        ((long)&(in_RDI->resUpdPool).super_QVLABase<QRhiResourceUpdateBatch_*>.
                                super_QVLABaseBase.s + 4));
  *(GLenum *)((in_RDI->resUpdPool).super_QVLAStorage<8UL,_8UL,_4LL>.array + 0xc) = GVar1;
  GVar1 = toGlTextureCompareFunc
                    (*(CompareOp *)
                      &(in_RDI->resUpdPool).super_QVLABase<QRhiResourceUpdateBatch_*>.
                       super_QVLABaseBase.ptr);
  *(GLenum *)((in_RDI->resUpdPool).super_QVLAStorage<8UL,_8UL,_4LL>.array + 0x10) = GVar1;
  *(int *)((in_RDI->resUpdPool).super_QVLAStorage<8UL,_8UL,_4LL>.array + 0x14) =
       *(int *)((in_RDI->resUpdPool).super_QVLAStorage<8UL,_8UL,_4LL>.array + 0x14) + 1;
  QRhiImplementation::registerResource(this_00,(QRhiResource *)rhiD,(bool)unaff_retaddr);
  return true;
}

Assistant:

bool QGles2Sampler::create()
{
    d.glminfilter = toGlMinFilter(m_minFilter, m_mipmapMode);
    d.glmagfilter = toGlMagFilter(m_magFilter);
    d.glwraps = toGlWrapMode(m_addressU);
    d.glwrapt = toGlWrapMode(m_addressV);
    d.glwrapr = toGlWrapMode(m_addressW);
    d.gltexcomparefunc = toGlTextureCompareFunc(m_compareOp);

    generation += 1;
    QRHI_RES_RHI(QRhiGles2);
    rhiD->registerResource(this, false);
    return true;
}